

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O2

int __thiscall
SPP::solveSPP(SPP *this,Satellite **GPSPosAndVel,Satellite **BDSPosAndVel,Obs **GPSObs,Obs **BDSObs,
             Ephemeris **GPSEph,Ephemeris **BDSEph,ELLIPSOID type)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Satellite *pSVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  XYZ SatPosition;
  XYZ station;
  XYZ SatPosition_00;
  XYZ station_00;
  XYZ obj;
  XYZ obj_00;
  Vector3d a;
  Vector3d a_00;
  undefined8 uVar13;
  int iVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  long lVar18;
  Satellite **ppSVar19;
  ulong uVar20;
  undefined8 *puVar21;
  uint uVar22;
  int iVar23;
  double dVar24;
  XYZ *pXVar25;
  uint uVar26;
  long lVar27;
  uint row;
  long lVar28;
  int i;
  int iVar29;
  int row_00;
  MatrixXd tmp2;
  MatrixXd B_T;
  double local_1d0;
  Matrix<double,_3,_1> local_1c8;
  MatrixXd tmp1;
  double local_1a8;
  int flag;
  double local_190;
  double local_188;
  long local_180;
  Satellite **local_178;
  ulong local_170;
  double local_168;
  XYZ NEU;
  MatrixXd v;
  MatrixXd tmp3;
  MatrixXd w;
  MatrixXd P;
  MatrixXd B;
  MatrixXd tmp4;
  Matrix<double,_3,_1> local_c8;
  MatrixXd tmp5;
  MatrixXd tmp10;
  MatrixXd tmp9;
  MatrixXd tmp8;
  MatrixXd tmp7;
  MatrixXd tmp6;
  
  local_170 = 0;
  for (lVar18 = 0x90; uVar22 = (uint)local_170, lVar18 != 0x1790; lVar18 = lVar18 + 0xb8) {
    local_170 = (ulong)(uVar22 + (*(double *)((long)&((*GPSPosAndVel)->SatPosition).X + lVar18) !=
                                 -1.0));
  }
  uVar26 = 0;
  for (lVar18 = 0x90; lVar18 != 0x2e90; lVar18 = lVar18 + 0xb8) {
    uVar26 = uVar26 + (*(double *)((long)&((*BDSPosAndVel)->SatPosition).X + lVar18) != -1.0);
  }
  (this->result).BDSObsNum = uVar26;
  (this->result).GPSObsNum = uVar22;
  iVar14 = 1;
  if (((uVar26 != 0 || 4 < uVar22) && (4 < uVar26 || uVar22 != 0)) &&
     ((row = uVar26 + uVar22, uVar22 == 0 || ((uVar26 == 0 || (4 < row)))))) {
    uVar22 = (uint)(uVar22 == 0 || uVar26 == 0);
    local_1c8.rows = 3;
    local_1c8.cols = 1;
    local_178 = GPSPosAndVel;
    local_1c8.data = (double *)operator_new__(0x18);
    Matrix<double,_3,_1>::Zero(&local_1c8);
    Matrix<double,_-1,_-1>::Matrix(&B,row,uVar22 ^ 5);
    Matrix<double,_-1,_-1>::Matrix(&P,B.rows,B.rows);
    Matrix<double,_-1,_-1>::Matrix(&w,B.rows,1);
    Matrix<double,_-1,_-1>::Zero(&B);
    Matrix<double,_-1,_-1>::Zero(&P);
    local_188 = (this->result).GPSR;
    local_190 = (this->result).BDSR;
    iVar14 = 4 - (uint)((int)local_170 == 0);
    for (iVar23 = 0; iVar23 != 0xb; iVar23 = iVar23 + 1) {
      XYZ::XYZ(&NEU);
      dVar24 = 0.0;
      lVar28 = 500;
      lVar18 = 0x670;
      lVar27 = 0;
      iVar29 = 0;
      ppSVar19 = local_178;
      uVar20 = local_170;
      while ((lVar28 - 500U < 0x20 && ((int)uVar20 != 0))) {
        dVar2 = *(double *)((long)&(*ppSVar19)->n + lVar27);
        if ((dVar2 != -1.0) || (NAN(dVar2))) {
          puVar21 = (undefined8 *)((long)(*GPSObs)->psr + (long)dVar24 + -0x10);
          dVar2 = (double)puVar21[1];
          *(undefined8 *)&(this->result).ObsTime = *puVar21;
          (this->result).ObsTime.SOW = dVar2;
          pXVar25 = (XYZ *)&B_T;
          local_168 = dVar24;
          XYZ::XYZ((XYZ *)&B_T);
          pSVar8 = *local_178;
          SatPosition.Z = *(double *)((long)&(pSVar8->SatPosition).Z + lVar27);
          SatPosition._0_16_ = *(undefined1 (*) [16])((long)&(pSVar8->SatPosition).X + lVar27);
          EarthRotationFix((SPP *)pXVar25,*(double *)((long)&pSVar8->deltat + lVar27),SatPosition,
                           GPS,(XYZ *)&B_T);
          *(double *)((long)&(this->result).UserPositionXYZ.X + lVar18) = local_1d0;
          puVar21 = (undefined8 *)((long)&(this->result).ObsTime.Week + lVar18);
          *puVar21 = B_T._0_8_;
          puVar21[1] = B_T.data;
          tmp2.rows = 3;
          tmp2.cols = 1;
          pdVar15 = (double *)operator_new__(0x18);
          tmp2.data = pdVar15;
          uVar13 = B_T._0_8_;
          pdVar15 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&tmp2,0,0);
          *pdVar15 = (double)uVar13;
          pdVar15 = B_T.data;
          pdVar16 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&tmp2,1,0);
          *pdVar16 = (double)pdVar15;
          pdVar15 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&tmp2,2,0);
          *pdVar15 = local_1d0;
          a.data = local_1c8.data;
          a.rows = local_1c8.rows;
          a.cols = local_1c8.cols;
          dVar9 = dist(a,(Vector3d)tmp2);
          pdVar15 = Matrix<double,_3,_1>::operator()(&local_1c8,0,0);
          dVar2 = *pdVar15;
          pdVar15 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&tmp2,0,0);
          dVar3 = *pdVar15;
          pdVar15 = Matrix<double,_3,_1>::operator()(&local_1c8,1,0);
          dVar4 = *pdVar15;
          pdVar15 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&tmp2,1,0);
          dVar5 = *pdVar15;
          pdVar15 = Matrix<double,_3,_1>::operator()(&local_1c8,2,0);
          dVar6 = *pdVar15;
          pdVar15 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&tmp2,2,0);
          dVar7 = *pdVar15;
          *(double *)((long)this + lVar28 * 8 + -0x600) = dVar9;
          local_180 = lVar18;
          XYZ::XYZ((XYZ *)&tmp1);
          pdVar15 = Matrix<double,_3,_1>::operator()(&local_1c8,0,0);
          NEU.X = *pdVar15;
          pdVar15 = Matrix<double,_3,_1>::operator()(&local_1c8,1,0);
          NEU.Y = *pdVar15;
          pdVar15 = Matrix<double,_3,_1>::operator()(&local_1c8,2,0);
          NEU.Z = *pdVar15;
          station.Y = NEU.Y;
          station.X = NEU.X;
          station.Z = NEU.Z;
          obj.Z = local_1d0;
          obj._0_16_ = B_T;
          XYZ2NEU(station,obj,type,(XYZ *)&tmp1);
          dVar24 = atan(local_1a8 /
                        SQRT((double)tmp1._0_8_ * (double)tmp1._0_8_ +
                             (double)tmp1.data * (double)tmp1.data));
          dVar10 = atan2((double)tmp1._0_8_,(double)tmp1.data);
          *(double *)((long)this + lVar28 * 8 + -0x300) = dVar24;
          *(double *)(&(this->result).ObsTime.Week + lVar28 * 2) = dVar10;
          dVar11 = Hopefield(dVar24,(this->result).UserPositionBLH.H,15.0,1013.25,0.5);
          dVar24 = local_168;
          dVar10 = (this->result).UserPositionBLH.H;
          dVar12 = (*(double *)((long)&(*local_178)->clkdif + lVar27) * 299792458.0 +
                   ((*(double *)((long)(*GPSObs)->psr + (long)local_168) * 2.54572778016316 +
                    *(double *)((long)(*GPSObs)->psr + (long)local_168 + 8) * -1.5457277801631601) -
                   dVar9)) - local_188;
          pdVar15 = Matrix<double,_-1,_-1>::operator()(&w,iVar29,0);
          *pdVar15 = dVar12 - (double)(~-(ulong)(5000.0 < dVar10) & (ulong)dVar11);
          pdVar15 = Matrix<double,_-1,_-1>::operator()(&B,iVar29,0);
          *pdVar15 = (dVar2 - dVar3) / dVar9;
          pdVar15 = Matrix<double,_-1,_-1>::operator()(&B,iVar29,1);
          *pdVar15 = (dVar4 - dVar5) / dVar9;
          pdVar15 = Matrix<double,_-1,_-1>::operator()(&B,iVar29,2);
          *pdVar15 = (dVar6 - dVar7) / dVar9;
          pdVar15 = Matrix<double,_-1,_-1>::operator()(&B,iVar29,3);
          *pdVar15 = 1.0;
          pdVar15 = Matrix<double,_-1,_-1>::operator()(&P,iVar29,iVar29);
          lVar18 = local_180;
          *pdVar15 = 1.0;
          iVar29 = iVar29 + 1;
          Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)&tmp2);
          ppSVar19 = local_178;
          uVar20 = local_170;
        }
        lVar28 = lVar28 + 1;
        lVar18 = lVar18 + 0x18;
        lVar27 = lVar27 + 0xb8;
        dVar24 = (double)((long)dVar24 + 0x70);
      }
      if (uVar26 != 0) {
        lVar18 = 0x15;
        lVar28 = 0;
        puVar21 = (undefined8 *)&(this->result).field_0x70;
        pdVar15 = (this->result).BDSDist;
        for (lVar27 = 0; lVar27 != 0x2e00; lVar27 = lVar27 + 0xb8) {
          dVar24 = *(double *)((long)&(*BDSPosAndVel)->n + lVar27);
          if ((dVar24 != -1.0) || (NAN(dVar24))) {
            pXVar25 = (XYZ *)&B_T;
            local_180 = lVar18;
            XYZ::XYZ((XYZ *)&B_T);
            pSVar8 = *BDSPosAndVel;
            SatPosition_00.Z = *(double *)((long)&(pSVar8->SatPosition).Z + lVar27);
            SatPosition_00._0_16_ = *(undefined1 (*) [16])((long)&(pSVar8->SatPosition).X + lVar27);
            EarthRotationFix((SPP *)pXVar25,*(double *)((long)&pSVar8->deltat + lVar27),
                             SatPosition_00,BDS,(XYZ *)&B_T);
            puVar21[2] = local_1d0;
            *puVar21 = B_T._0_8_;
            puVar21[1] = B_T.data;
            puVar1 = (undefined8 *)((long)(*BDSObs)->psr + lVar28 + -0x10);
            dVar24 = (double)puVar1[1];
            *(undefined8 *)&(this->result).ObsTime = *puVar1;
            (this->result).ObsTime.SOW = dVar24;
            tmp2.rows = 3;
            tmp2.cols = 1;
            pdVar16 = (double *)operator_new__(0x18);
            tmp2.data = pdVar16;
            uVar13 = B_T._0_8_;
            pdVar16 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&tmp2,0,0);
            *pdVar16 = (double)uVar13;
            pdVar16 = B_T.data;
            pdVar17 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&tmp2,1,0);
            *pdVar17 = (double)pdVar16;
            pdVar16 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&tmp2,2,0);
            *pdVar16 = local_1d0;
            a_00.data = local_1c8.data;
            a_00.rows = local_1c8.rows;
            a_00.cols = local_1c8.cols;
            dVar9 = dist(a_00,(Vector3d)tmp2);
            pdVar16 = Matrix<double,_3,_1>::operator()(&local_1c8,0,0);
            dVar24 = *pdVar16;
            pdVar16 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&tmp2,0,0);
            dVar2 = *pdVar16;
            pdVar16 = Matrix<double,_3,_1>::operator()(&local_1c8,1,0);
            dVar3 = *pdVar16;
            pdVar16 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&tmp2,1,0);
            dVar4 = *pdVar16;
            pdVar16 = Matrix<double,_3,_1>::operator()(&local_1c8,2,0);
            dVar5 = *pdVar16;
            pdVar16 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&tmp2,2,0);
            dVar6 = *pdVar16;
            *pdVar15 = dVar9;
            XYZ::XYZ((XYZ *)&tmp1);
            pdVar16 = Matrix<double,_3,_1>::operator()(&local_1c8,0,0);
            NEU.X = *pdVar16;
            pdVar16 = Matrix<double,_3,_1>::operator()(&local_1c8,1,0);
            NEU.Y = *pdVar16;
            pdVar16 = Matrix<double,_3,_1>::operator()(&local_1c8,2,0);
            NEU.Z = *pdVar16;
            station_00.Y = NEU.Y;
            station_00.X = NEU.X;
            station_00.Z = NEU.Z;
            obj_00.Z = local_1d0;
            obj_00._0_16_ = B_T;
            XYZ2NEU(station_00,obj_00,type,(XYZ *)&tmp1);
            local_168 = atan(local_1a8 /
                             SQRT((double)tmp1._0_8_ * (double)tmp1._0_8_ +
                                  (double)tmp1.data * (double)tmp1.data));
            dVar7 = atan2((double)tmp1._0_8_,(double)tmp1.data);
            pdVar15[0x60] = local_168;
            pdVar15[0xc0] = dVar7;
            dVar11 = Hopefield(local_168,(this->result).UserPositionBLH.H,15.0,1013.25,0.5);
            dVar7 = (this->result).UserPositionBLH.H;
            dVar12 = (*(double *)((long)&(*BDSPosAndVel)->clkdif + lVar27) * 299792458.0 +
                     ((*(double *)((long)(*BDSObs)->psr + lVar28) * 2.943681770145979 +
                      *(double *)((long)(*BDSObs)->psr + lVar28 + 8) * -1.943681770145979) - dVar9))
                     - local_190;
            dVar10 = *(double *)(&(*BDSEph)->sys + local_180 * 2);
            pdVar16 = Matrix<double,_-1,_-1>::operator()(&w,iVar29,0);
            *pdVar16 = ((dVar10 * -7.306023042307046e+26) / 8.278839752039997e+17 + dVar12) -
                       (double)(~-(ulong)(5000.0 < dVar7) & (ulong)dVar11);
            pdVar16 = Matrix<double,_-1,_-1>::operator()(&B,iVar29,0);
            *pdVar16 = (dVar24 - dVar2) / dVar9;
            pdVar16 = Matrix<double,_-1,_-1>::operator()(&B,iVar29,1);
            *pdVar16 = (dVar3 - dVar4) / dVar9;
            pdVar16 = Matrix<double,_-1,_-1>::operator()(&B,iVar29,2);
            *pdVar16 = (dVar5 - dVar6) / dVar9;
            pdVar16 = Matrix<double,_-1,_-1>::operator()(&B,iVar29,iVar14);
            *pdVar16 = 1.0;
            pdVar16 = Matrix<double,_-1,_-1>::operator()(&P,iVar29,iVar29);
            *pdVar16 = 1.0;
            iVar29 = iVar29 + 1;
            Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)&tmp2);
            lVar18 = local_180;
          }
          pdVar15 = pdVar15 + 1;
          lVar28 = lVar28 + 0x70;
          puVar21 = puVar21 + 3;
          lVar18 = lVar18 + 0x1b;
        }
      }
      flag = 0;
      B_T = Matrix<double,_-1,_-1>::transpose(&B);
      tmp1 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&B_T,&P);
      tmp2 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&tmp1,&B);
      tmp3 = Matrix<double,_-1,_-1>::inverse(&tmp2,&flag);
      tmp4 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&tmp3,&B_T);
      tmp5 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&tmp4,&P);
      v = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&tmp5,&w);
      if (flag != 0) {
        Matrix<double,_-1,_-1>::deleteMatrix(&B_T);
        Matrix<double,_-1,_-1>::deleteMatrix(&tmp1);
        Matrix<double,_-1,_-1>::deleteMatrix(&tmp2);
        Matrix<double,_-1,_-1>::deleteMatrix(&tmp3);
        Matrix<double,_-1,_-1>::deleteMatrix(&tmp4);
        Matrix<double,_-1,_-1>::deleteMatrix(&tmp5);
        Matrix<double,_-1,_-1>::deleteMatrix(&P);
        Matrix<double,_-1,_-1>::deleteMatrix(&w);
        Matrix<double,_3,_1>::deleteMatrix(&local_1c8);
        Matrix<double,_-1,_-1>::deleteMatrix(&B);
        Matrix<double,_-1,_-1>::deleteMatrix(&v);
        return 5;
      }
      pdVar15 = Matrix<double,_-1,_-1>::operator()(&v,0,0);
      dVar24 = *pdVar15;
      pdVar15 = Matrix<double,_3,_1>::operator()(&local_1c8,0,0);
      *pdVar15 = dVar24 + *pdVar15;
      pdVar15 = Matrix<double,_-1,_-1>::operator()(&v,1,0);
      dVar24 = *pdVar15;
      pdVar15 = Matrix<double,_3,_1>::operator()(&local_1c8,1,0);
      *pdVar15 = dVar24 + *pdVar15;
      pdVar15 = Matrix<double,_-1,_-1>::operator()(&v,2,0);
      dVar24 = *pdVar15;
      pdVar15 = Matrix<double,_3,_1>::operator()(&local_1c8,2,0);
      *pdVar15 = dVar24 + *pdVar15;
      pdVar15 = Matrix<double,_-1,_-1>::operator()(&v,3,0);
      local_188 = local_188 + *pdVar15;
      if (uVar26 != 0) {
        pdVar15 = Matrix<double,_-1,_-1>::operator()(&v,iVar14,0);
        local_190 = local_190 + *pdVar15;
      }
      tmp6 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&B,&v);
      tmp7 = Matrix<double,_-1,_-1>::operator+(&tmp6,&w);
      tmp8 = Matrix<double,_-1,_-1>::transpose(&tmp7);
      tmp9 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&tmp8,&P);
      tmp10 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&tmp9,&tmp7);
      pdVar15 = Matrix<double,_-1,_-1>::operator()(&tmp10,0,0);
      dVar24 = *pdVar15 / (double)(int)(uVar22 + row + -5);
      if (dVar24 < 0.0) {
        dVar24 = sqrt(dVar24);
      }
      else {
        dVar24 = SQRT(dVar24);
      }
      pdVar15 = Matrix<double,_-1,_-1>::operator()(&tmp3,0,0);
      dVar2 = *pdVar15;
      pdVar15 = Matrix<double,_-1,_-1>::operator()(&tmp3,1,1);
      dVar3 = *pdVar15;
      pdVar15 = Matrix<double,_-1,_-1>::operator()(&tmp3,2,2);
      dVar2 = dVar2 + dVar3 + *pdVar15;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      (this->result).UserPositionSigma = dVar24;
      (this->result).PDop = dVar2;
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp6);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp7);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp8);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp9);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp10);
      local_c8.rows = 3;
      local_c8.cols = 1;
      local_c8.data = (double *)operator_new__(0x18);
      iVar29 = 3;
      for (row_00 = 0; row_00 < iVar29; row_00 = row_00 + 1) {
        pdVar15 = Matrix<double,_-1,_-1>::operator()(&v,row_00,0);
        dVar24 = *pdVar15;
        pdVar15 = Matrix<double,_3,_1>::operator()(&local_c8,row_00,0);
        *pdVar15 = dVar24;
        iVar29 = local_c8.rows;
      }
      dVar24 = Matrix<double,_3,_1>::norm(&local_c8);
      if (dVar24 < 1e-05) {
        Matrix<double,_-1,_-1>::deleteMatrix(&B_T);
        Matrix<double,_-1,_-1>::deleteMatrix(&tmp1);
        Matrix<double,_-1,_-1>::deleteMatrix(&tmp2);
        Matrix<double,_-1,_-1>::deleteMatrix(&tmp3);
        Matrix<double,_-1,_-1>::deleteMatrix(&tmp4);
        Matrix<double,_-1,_-1>::deleteMatrix(&tmp5);
        Matrix<double,_3,_1>::deleteMatrix(&local_c8);
        Matrix<double,_-1,_-1>::deleteMatrix(&v);
        break;
      }
      Matrix<double,_-1,_-1>::deleteMatrix(&B_T);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp1);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp2);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp3);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp4);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp5);
      Matrix<double,_3,_1>::deleteMatrix(&local_c8);
      Matrix<double,_-1,_-1>::deleteMatrix(&v);
    }
    (this->result).GPSR = local_188;
    (this->result).BDSR = local_190;
    iVar14 = 0;
    pdVar15 = Matrix<double,_3,_1>::operator()(&local_1c8,0,0);
    (this->result).UserPositionXYZ.X = *pdVar15;
    pdVar15 = Matrix<double,_3,_1>::operator()(&local_1c8,1,0);
    (this->result).UserPositionXYZ.Y = *pdVar15;
    pdVar15 = Matrix<double,_3,_1>::operator()(&local_1c8,2,0);
    (this->result).UserPositionXYZ.Z = *pdVar15;
    XYZ2BLH((this->result).UserPositionXYZ,type,&(this->result).UserPositionBLH);
    XYZ::XYZ(&NEU);
    XYZ2NEU((this->result).UserRefPositionXYZ,(this->result).UserPositionXYZ,type,&NEU);
    (this->result).diffNeu.X = NEU.X;
    (this->result).diffNeu.Y = NEU.Y;
    (this->result).diffNeu.Z = NEU.Z;
    Matrix<double,_-1,_-1>::deleteMatrix(&P);
    Matrix<double,_-1,_-1>::deleteMatrix(&w);
    Matrix<double,_3,_1>::deleteMatrix(&local_1c8);
    Matrix<double,_-1,_-1>::deleteMatrix(&B);
  }
  return iVar14;
}

Assistant:

int SPP::solveSPP(Satellite* &&GPSPosAndVel, Satellite* &&BDSPosAndVel,
                  Obs* &&GPSObs, Obs* &&BDSObs, Ephemeris* &&GPSEph,
                  Ephemeris* &&BDSEph, ELLIPSOID type)
{
    int GPSObsNum = 0, BDSObsNum = 0;
    int cols = 5;
    for(int i = 0; i < MAXGPSSRN; ++i)
        if(GPSPosAndVel[i].n != -1)
            GPSObsNum ++;
    for(int i = 0; i < MAXBDSSRN; ++i)
        if(BDSPosAndVel[i].n != -1)
            BDSObsNum ++;

    this->result.BDSObsNum = BDSObsNum;
    this->result.GPSObsNum = GPSObsNum;

    if(GPSObsNum == 0 || BDSObsNum == 0)
        cols = 4;
    if(BDSObsNum ==0 && GPSObsNum <= 4)
        return NOT_ENOUGH_OBS;
    if(GPSObsNum == 0 && BDSObsNum <= 4)
        return NOT_ENOUGH_OBS;
    if(GPSObsNum != 0 && BDSObsNum != 0 && GPSObsNum + BDSObsNum < 5)
        return NOT_ENOUGH_OBS;
    
    // 测站位置
    Vector3d RefPos;
    RefPos.Zero();
    // n * m
    MatrixXd B(BDSObsNum + GPSObsNum, cols);
    // n * n
    MatrixXd P(B.row(), B.row());
    // n * 1
    MatrixXd w(B.row(), 1);
    B.Zero();
    P.Zero();
    int count = 0;
    double GPSR = this->result.GPSR, BDSR = this->result.BDSR;
    
    while (count <= 10)
    {
        int num = 0;
        XYZ station;
        for(int prn = 0; prn < MAXGPSSRN; ++prn)
        {
            if(GPSObsNum == 0)
                break;
            if(GPSPosAndVel[prn].n == -1){
                continue;
            }
            this->result.ObsTime = GPSObs[prn].ObsTime;

            // 地球自转改正
            XYZ fix;
            EarthRotationFix(GPSPosAndVel[prn].deltat, GPSPosAndVel[prn].SatPosition, GPS, fix);
            this->result.GPSPosi[prn] = fix;
            Vector3d SatPos;
            SatPos(0, 0) = fix.X;
            SatPos(1, 0) = fix.Y;
            SatPos(2, 0) = fix.Z;
            double distance = dist(RefPos, SatPos);
            double l = (RefPos(0, 0) - SatPos(0, 0)) / distance;
            double m = (RefPos(1, 0) - SatPos(1, 0)) / distance;
            double n = (RefPos(2, 0) - SatPos(2, 0)) / distance;
            this->result.GPSDist[prn] = distance;

            // 对流层改正
            double T = 0;
            XYZ satNEU;
            station.X = RefPos(0, 0);
            station.Y = RefPos(1, 0);
            station.Z = RefPos(2, 0);
            XYZ2NEU(station, fix, type, satNEU);

            double E = this->CalculateEA(satNEU);
            double A = this->CalculateAzi(satNEU);

            this->result.GPSelev[prn] = E;
            this->result.GPSAzimuth[prn] = A;

            T = Hopefield(E, result.UserPositionBLH.H);
            if(result.UserPositionBLH.H > 5e3)
                T = 0;
            double IFpsr = GPSL1 * GPSL1 / (GPSL1 * GPSL1 - GPSL2 * GPSL2) * GPSObs[prn].psr[0] - 
                           GPSL2 * GPSL2 / (GPSL1 * GPSL1 - GPSL2 * GPSL2) * GPSObs[prn].psr[1];
            // w矩阵
            w(num, 0) = IFpsr - distance + GPSPosAndVel[prn].clkdif * LIGHTSPEED - GPSR - T;
            // B矩阵
            B(num, 0) = l;
            B(num, 1) = m;
            B(num, 2) = n;
            B(num, 3) = 1;

            P(num, num) = 1.0;// / pow(GPSObs[prn].psr_sigma[0] + GPSObs[prn].psr_sigma[1], 2);
            num ++;
            SatPos.deleteMatrix();
        }
        // BDS
        for(int prn = 0; prn < MAXBDSSRN; ++prn)
        {
            if(BDSObsNum == 0)
                break;
            if(BDSPosAndVel[prn].n == -1){
                continue;
            }
            // 几何距离
            XYZ fix;
            EarthRotationFix(BDSPosAndVel[prn].deltat, BDSPosAndVel[prn].SatPosition, BDS, fix);
            this->result.BDSPosi[prn] = fix;
            this->result.ObsTime = BDSObs[prn].ObsTime;
            Vector3d SatPos;
            SatPos(0, 0) = fix.X;
            SatPos(1, 0) = fix.Y;
            SatPos(2, 0) = fix.Z;
            double distance = dist(RefPos, SatPos);
            double l = (RefPos(0, 0) - SatPos(0, 0)) / distance;
            double m = (RefPos(1, 0) - SatPos(1, 0)) / distance;
            double n = (RefPos(2, 0) - SatPos(2, 0)) / distance;
            this->result.BDSDist[prn] = distance;

            // 对流层改正
            double T = 0;
            XYZ satNEU;
            station.X = RefPos(0, 0);
            station.Y = RefPos(1, 0);
            station.Z = RefPos(2, 0);
            XYZ2NEU(station, fix, type, satNEU);

            double E = this->CalculateEA(satNEU);
            double A = this->CalculateAzi(satNEU);
            this->result.BDSelev[prn] = E;
            this->result.BDSAzimuth[prn] = A;

            T = Hopefield(E, result.UserPositionBLH.H);
            if(result.UserPositionBLH.H > 5e3)
                T = 0;
            double IFpsr = BDSB1 * BDSB1 / (BDSB1 * BDSB1 - BDSB3 * BDSB3) * BDSObs[prn].psr[0] - 
                           BDSB3 * BDSB3 / (BDSB1 * BDSB1 - BDSB3 * BDSB3) * BDSObs[prn].psr[1];
            
            // w矩阵
            w(num, 0) = IFpsr - distance + BDSPosAndVel[prn].clkdif * LIGHTSPEED - BDSR -
                        LIGHTSPEED * BDSB1 * BDSB1 * BDSEph[prn].tgd / ((BDSB1 * BDSB1 - BDSB3 * BDSB3)) - T;
            // B矩阵
            B(num, 0) = l;
            B(num, 1) = m;
            B(num, 2) = n;
            if(GPSObsNum == 0)
                B(num, 3) = 1;
            else
                B(num, 4) = 1;

            P(num, num) = 1.0;// / pow(BDSObs[prn].psr_sigma[0] + BDSObs[prn].psr_sigma[1], 2);
            num ++;
            SatPos.deleteMatrix();
        }
        int flag = 0;
        MatrixXd B_T = B.transpose();
        MatrixXd tmp1 = B_T * P;
        MatrixXd tmp2 = tmp1 * B;
        MatrixXd tmp3 = tmp2.inverse(flag);
        MatrixXd tmp4 = tmp3 * B_T;
        MatrixXd tmp5 = tmp4 * P;
        MatrixXd v = tmp5 * w;

        if(flag != 0){
            B_T.deleteMatrix();
            tmp1.deleteMatrix();
            tmp2.deleteMatrix();
            tmp3.deleteMatrix();
            tmp4.deleteMatrix();
            tmp5.deleteMatrix();
            P.deleteMatrix();
            w.deleteMatrix();
            RefPos.deleteMatrix();
            B.deleteMatrix();
            v.deleteMatrix();
            return NOT_INVERTIBLE;
        }
        RefPos(0, 0) += v(0, 0);
        RefPos(1, 0) += v(1, 0);
        RefPos(2, 0) += v(2, 0);
        GPSR += v(3, 0);
        if(GPSObsNum == 0 && BDSObsNum != 0)
            BDSR += v(3, 0);
        else if(BDSObsNum != 0 && GPSObsNum != 0)
            BDSR += v(4, 0);

        MatrixXd tmp6 = B * v;
        MatrixXd tmp7 = tmp6 + w;
        MatrixXd tmp8 = tmp7.transpose();
        MatrixXd tmp9 = tmp8 * P;
        MatrixXd tmp10 = tmp9 * tmp7;

        int Obsnum = 5;
        if(GPSObsNum ==0 || BDSObsNum ==0)
            Obsnum = 4;
        double sigma = sqrt(tmp10(0, 0) / (BDSObsNum + GPSObsNum - Obsnum));
        double pdop = sqrt(tmp3(0, 0) + tmp3(1, 1) + tmp3(2, 2));

        result.UserPositionSigma = sigma;
        result.PDop = pdop;
        tmp6.deleteMatrix();
        tmp7.deleteMatrix();
        tmp8.deleteMatrix();
        tmp9.deleteMatrix();
        tmp10.deleteMatrix();

        Vector3d dx;
        for(int i = 0; i < dx.row(); i++)
            dx(i, 0) = v(i, 0);
        if(dx.norm() < 1e-5)
        {
            B_T.deleteMatrix();
            tmp1.deleteMatrix();
            tmp2.deleteMatrix();
            tmp3.deleteMatrix();
            tmp4.deleteMatrix();
            tmp5.deleteMatrix();
            dx.deleteMatrix();
            v.deleteMatrix();
            break;        
        }
        count ++;

        B_T.deleteMatrix();
        tmp1.deleteMatrix();
        tmp2.deleteMatrix();
        tmp3.deleteMatrix();
        tmp4.deleteMatrix();
        tmp5.deleteMatrix();
        dx.deleteMatrix();
        v.deleteMatrix();
    }
    this->result.GPSR = GPSR;
    this->result.BDSR = BDSR;
    this->result.UserPositionXYZ.X = RefPos(0, 0);
    this->result.UserPositionXYZ.Y = RefPos(1, 0);
    this->result.UserPositionXYZ.Z = RefPos(2, 0);
    XYZ2BLH(result.UserPositionXYZ, type, result.UserPositionBLH);
    XYZ NEU;
    XYZ2NEU(result.UserRefPositionXYZ, result.UserPositionXYZ, type, NEU);
    result.diffNeu = NEU;

    P.deleteMatrix();
    w.deleteMatrix();
    RefPos.deleteMatrix();
    B.deleteMatrix();
    return 0;
}